

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O3

QFixed __thiscall
QTextDocumentLayoutPrivate::findY
          (QTextDocumentLayoutPrivate *this,QFixed yFrom,QTextLayoutStruct *layoutStruct,
          QFixed requiredWidth)

{
  QTextFrame *this_00;
  QFixed QVar1;
  int iVar2;
  QTextFrameLayoutData *data;
  long lVar3;
  QTextFrameLayoutData *data_00;
  long lVar4;
  QFixed y;
  QTextDocumentLayoutPrivate *this_01;
  _func_int **pp_Var5;
  long in_FS_OFFSET;
  int local_50;
  QFixed local_40;
  QFixed local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c.val = 0;
  local_40.val = 0;
  QVar1.val = (layoutStruct->x_right).val - (layoutStruct->x_left).val;
  local_50 = yFrom.val;
  if (requiredWidth.val <= QVar1.val) {
    local_50 = yFrom.val;
    QVar1.val = requiredWidth.val;
  }
  do {
    y.val = local_50;
    floatMargins(this,y,layoutStruct,&local_40,&local_3c);
    if (QVar1.val <= local_3c.val - local_40.val) break;
    this_00 = layoutStruct->frame;
    data = QTextFrame::layoutData(this_00);
    if (data == (QTextFrameLayoutData *)0x0) {
      lVar3 = QMetaObject::cast((QObject *)&QTextTable::staticMetaObject);
      if (lVar3 == 0) {
        data = (QTextFrameLayoutData *)operator_new(0x78);
        data->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextFrameData_007dcf10;
        data[1]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
        data[2]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
        data[3]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
        data[4]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
        data[5]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
        data[6]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
        data[7]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
        data[8]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
        *(undefined4 *)&data[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
        data[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
        *(undefined2 *)&data[0xb]._vptr_QTextFrameLayoutData = 0x101;
        data[0xc]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
        data[0xd]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
        data[0xe]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      }
      else {
        data = (QTextFrameLayoutData *)operator_new(0x160);
        data[1]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
        data[2]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
        data[3]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
        data[4]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
        data[5]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
        data[6]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
        data[7]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
        data[8]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
        *(undefined4 *)&data[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
        data[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
        *(undefined2 *)&data[0xb]._vptr_QTextFrameLayoutData = 0x101;
        data[0xc]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
        data[0xd]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
        data[0xe]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
        data[0xf]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
        data->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextTableData_007dd0c0;
        data[0x2a]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
        data[0x2b]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
        memset(data + 0x11,0,0xc0);
      }
      QTextFrame::setLayoutData(this_00,data);
    }
    if (data[0xe]._vptr_QTextFrameLayoutData == (_func_int **)0x0) break;
    local_50 = 0x1fffffc0;
    lVar3 = 8;
    pp_Var5 = (_func_int **)0x0;
    do {
      lVar4 = *(long *)((long)data[0xd]._vptr_QTextFrameLayoutData + lVar3 + -8);
      if ((lVar4 == 0) || (*(int *)(lVar4 + 4) == 0)) {
        this_01 = (QTextDocumentLayoutPrivate *)0x0;
      }
      else {
        this_01 = *(QTextDocumentLayoutPrivate **)
                   ((long)data[0xd]._vptr_QTextFrameLayoutData + lVar3);
      }
      this = this_01;
      data_00 = QTextFrame::layoutData((QTextFrame *)this_01);
      if (data_00 == (QTextFrameLayoutData *)0x0) {
        lVar4 = QMetaObject::cast((QObject *)&QTextTable::staticMetaObject);
        if (lVar4 == 0) {
          data_00 = (QTextFrameLayoutData *)operator_new(0x78);
          data_00->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextFrameData_007dcf10;
          data_00[1]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data_00[2]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data_00[3]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data_00[4]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data_00[5]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data_00[6]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data_00[7]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data_00[8]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          *(undefined4 *)&data_00[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
          data_00[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          *(undefined2 *)&data_00[0xb]._vptr_QTextFrameLayoutData = 0x101;
          data_00[0xc]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data_00[0xd]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data_00[0xe]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
        }
        else {
          data_00 = (QTextFrameLayoutData *)operator_new(0x160);
          data_00[1]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data_00[2]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data_00[3]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data_00[4]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data_00[5]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data_00[6]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data_00[7]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data_00[8]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          *(undefined4 *)&data_00[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
          data_00[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          *(undefined2 *)&data_00[0xb]._vptr_QTextFrameLayoutData = 0x101;
          data_00[0xc]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data_00[0xd]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data_00[0xe]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data_00[0xf]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data_00->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextTableData_007dd0c0;
          data_00[0x2a]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data_00[0x2b]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          memset(data_00 + 0x11,0,0xc0);
        }
        QTextFrame::setLayoutData((QTextFrame *)this_01,data_00);
        this = this_01;
      }
      if ((((*(char *)((long)&data_00[0xb]._vptr_QTextFrameLayoutData + 1) == '\0') &&
           (iVar2 = *(int *)((long)&data_00[1]._vptr_QTextFrameLayoutData + 4), iVar2 <= y.val)) &&
          (iVar2 = iVar2 + *(int *)((long)&data_00[2]._vptr_QTextFrameLayoutData + 4), y.val < iVar2
          )) && (iVar2 <= local_50)) {
        local_50 = iVar2;
      }
      pp_Var5 = (_func_int **)((long)pp_Var5 + 1);
      lVar3 = lVar3 + 0x10;
    } while (pp_Var5 < data[0xe]._vptr_QTextFrameLayoutData);
  } while (local_50 != 0x1fffffc0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QFixed)y.val;
}

Assistant:

QFixed QTextDocumentLayoutPrivate::findY(QFixed yFrom, const QTextLayoutStruct *layoutStruct, QFixed requiredWidth) const
{
    QFixed right, left;
    requiredWidth = qMin(requiredWidth, layoutStruct->x_right - layoutStruct->x_left);

//     qDebug() << "findY:" << yFrom;
    while (1) {
        floatMargins(yFrom, layoutStruct, &left, &right);
//         qDebug() << "    yFrom=" << yFrom<<"right=" << right << "left=" << left << "requiredWidth=" << requiredWidth;
        if (right-left >= requiredWidth)
            break;

        // move float down until we find enough space
        QFixed newY = QFIXED_MAX;
        QTextFrameData *lfd = data(layoutStruct->frame);
        for (int i = 0; i < lfd->floats.size(); ++i) {
            QTextFrameData *fd = data(lfd->floats.at(i));
            if (!fd->layoutDirty) {
                if (fd->position.y <= yFrom && fd->position.y + fd->size.height > yFrom)
                    newY = qMin(newY, fd->position.y + fd->size.height);
            }
        }
        if (newY == QFIXED_MAX)
            break;
        yFrom = newY;
    }
    return yFrom;
}